

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O0

void __thiscall
helics::FirewallOperator::FirewallOperator
          (FirewallOperator *this,function<bool_(const_helics::Message_*)> *userCheckFunction)

{
  function<bool_(const_helics::Message_*)> *in_RSI;
  FilterOperator *in_RDI;
  function<bool_(const_helics::Message_*)> *in_stack_ffffffffffffffd8;
  
  FilterOperator::FilterOperator(in_RDI);
  in_RDI->_vptr_FilterOperator = (_func_int **)&PTR__FirewallOperator_009559e0;
  std::function<bool_(const_helics::Message_*)>::function(in_RSI,in_stack_ffffffffffffffd8);
  std::atomic<helics::FirewallOperator::operations>::atomic
            ((atomic<helics::FirewallOperator::operations> *)(in_RDI + 5),drop);
  return;
}

Assistant:

FirewallOperator::FirewallOperator(std::function<bool(const Message*)> userCheckFunction):
    checkFunction(std::move(userCheckFunction))
{
}